

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Client::Client(Client *this,bool init)

{
  undefined7 in_register_00000031;
  undefined8 uStack_8;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_00108c78;
  if ((int)CONCAT71(in_register_00000031,init) != 0) {
    uStack_8 = &PTR__Client_00108c78;
    std::call_once<restincurl::Client::Client(bool)::_lambda()_1_>
              (&Client::flag,(anon_class_1_0_00000001 *)((long)&uStack_8 + 7));
  }
  return;
}

Assistant:

Client(const bool init = true) {
            if (init) {
                static std::once_flag flag;
                std::call_once(flag, [] {
                    RESTINCURL_LOG("One time initialization of curl.");
                    curl_global_init(CURL_GLOBAL_DEFAULT);
                });
            }
        }